

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O3

char * __thiscall nuraft::buffer::get_str(buffer *this)

{
  uint uVar1;
  short sVar2;
  buffer *pbVar3;
  uint uVar4;
  uint uVar6;
  long lVar7;
  buffer *pbVar8;
  ulong uVar5;
  
  uVar1 = *(uint *)this;
  uVar4 = uVar1 >> 0x10;
  uVar5 = (ulong)uVar4;
  if ((int)uVar1 < 0) {
    uVar4 = *(uint *)(this + 4);
    uVar5 = (ulong)uVar4;
    uVar6 = uVar1 & 0x7fffffff;
    lVar7 = uVar5 + 8;
  }
  else {
    uVar6 = uVar1 & 0xffff;
    lVar7 = uVar5 + 4;
  }
  pbVar3 = this + lVar7;
  sVar2 = (short)(uVar1 >> 0x10);
  if (uVar4 < uVar6) {
    lVar7 = 0;
    pbVar8 = pbVar3;
    do {
      if (*pbVar8 == (buffer)0x0) {
        if (lVar7 != 0) {
          if ((ulong)uVar6 <= uVar5 - lVar7) {
            return (char *)0x0;
          }
          if (-1 < (int)uVar1) {
            *(short *)(this + 2) = (sVar2 - (short)lVar7) + 1;
            return (char *)pbVar3;
          }
          *(int *)(this + 4) = (*(int *)(this + 4) - (int)lVar7) + 1;
          return (char *)pbVar3;
        }
        goto LAB_0018866d;
      }
      lVar7 = lVar7 + -1;
      pbVar8 = pbVar8 + 1;
    } while (uVar5 - uVar6 != lVar7);
  }
  else {
LAB_0018866d:
    if ((int)uVar1 < 0) {
      *(int *)(this + 4) = *(int *)(this + 4) + 1;
    }
    else {
      *(short *)(this + 2) = sVar2 + 1;
    }
  }
  return (char *)0x0;
}

Assistant:

size_t buffer::pos() const {
    return (size_t)( __pos_of_block(this) );
}